

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int write_VD_boot_record(archive_write *a)

{
  void *pvVar1;
  int iVar2;
  uchar *puVar3;
  uchar *bp_00;
  uchar *bp;
  iso9660_conflict *iso9660;
  archive_write *a_local;
  
  pvVar1 = a->format_data;
  puVar3 = wb_buffptr(a);
  bp_00 = puVar3 + -1;
  set_VD_bp(bp_00,VDT_BOOT_RECORD,'\x01');
  builtin_memcpy(puVar3 + 7,"EL TORITO SPECIFICATION",0x17);
  set_unused_field_bp(bp_00,0x1f,0x27);
  set_unused_field_bp(bp_00,0x28,0x47);
  set_num_731(puVar3 + 0x47,
              *(uint32_t *)(*(long *)(*(long *)((long)pvVar1 + 0x10320) + 0x18) + 0xa4));
  set_unused_field_bp(bp_00,0x4c,0x800);
  iVar2 = wb_consume(a,0x800);
  return iVar2;
}

Assistant:

static int
write_VD_boot_record(struct archive_write *a)
{
	struct iso9660 *iso9660;
	unsigned char *bp;

	iso9660 = a->format_data;
	bp = wb_buffptr(a) -1;
	/* Volume Descriptor Type */
	set_VD_bp(bp, VDT_BOOT_RECORD, 1);
	/* Boot System Identifier */
	memcpy(bp+8, "EL TORITO SPECIFICATION", 23);
	set_unused_field_bp(bp, 8+23, 39);
	/* Unused */
	set_unused_field_bp(bp, 40, 71);
	/* Absolute pointer to first sector of Boot Catalog */
	set_num_731(bp+72,
	    iso9660->el_torito.catalog->file->content.location);
	/* Unused */
	set_unused_field_bp(bp, 76, LOGICAL_BLOCK_SIZE);

	return (wb_consume(a, LOGICAL_BLOCK_SIZE));
}